

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.h
# Opt level: O3

void __thiscall TTD::FileWriter::WriteRawByteBuff_Fixed<unsigned_int>(FileWriter *this,uint *data)

{
  ulong uVar1;
  size_t bufflen;
  
  bufflen = this->m_cursor;
  if (bufflen - 0x1ffffc < 0xffffffffffe00000) {
    WriteBlock(this,this->m_buffer,bufflen);
    this->m_cursor = 0;
    bufflen = 0;
  }
  js_memcpy_s(this->m_buffer + bufflen,4,data,4);
  uVar1 = this->m_cursor + 4;
  if (uVar1 < 0x200000) {
    this->m_cursor = uVar1;
    return;
  }
  TTDAbort_unrecoverable_error("Must have already reserved the space!");
}

Assistant:

void WriteRawByteBuff_Fixed(const T& data)
        {
            byte* trgt = this->ReserveSpaceForSmallData<sizeof(T)>();

            js_memcpy_s(trgt, sizeof(T), (const byte*)(&data), sizeof(T));

            this->CommitSpaceForSmallData(sizeof(T));
        }